

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::MedianFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  LogicalType local_1b0;
  LogicalType local_198;
  LogicalType local_180;
  string local_168;
  AggregateFunction local_148;
  
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"median","");
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_180,ANY);
  LogicalType::LogicalType(&local_198,ANY);
  LogicalType::LogicalType(&local_1b0,INVALID);
  EmptyQuantileFunction<duckdb::MedianFunction>(&local_148,&local_180,&local_198,&local_1b0);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_148);
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0243ae10;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_1b0);
  LogicalType::~LogicalType(&local_198);
  LogicalType::~LogicalType(&local_180);
  return in_RDI;
}

Assistant:

AggregateFunctionSet MedianFun::GetFunctions() {
	AggregateFunctionSet set("median");
	set.AddFunction(EmptyQuantileFunction<MedianFunction>(LogicalType::ANY, LogicalType::ANY, LogicalTypeId::INVALID));
	return set;
}